

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

void __thiscall cmState::SetBinaryDirectory(cmState *this,string *binaryDirectory)

{
  string *path;
  string sStack_38;
  
  path = &this->BinaryDirectory;
  std::__cxx11::string::_M_assign((string *)path);
  cmsys::SystemTools::ConvertToUnixSlashes(path);
  cmsys::SystemTools::CollapseFullPath(&sStack_38,path);
  cmsys::SystemTools::SplitPath(&sStack_38,&this->BinaryDirectoryComponents,true);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void cmState::SetBinaryDirectory(std::string const& binaryDirectory)
{
  this->BinaryDirectory = binaryDirectory;
  cmSystemTools::ConvertToUnixSlashes(this->BinaryDirectory);

  cmSystemTools::SplitPath(
      cmSystemTools::CollapseFullPath(this->BinaryDirectory),
        this->BinaryDirectoryComponents);
}